

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O3

void __thiscall Storage::Tape::TZX::get_data_block(TZX *this,DataBlock *data_block)

{
  bool bVar1;
  
  post_pulses(this,data_block->length_of_pilot_tone,data_block->length_of_pilot_pulse);
  PulseQueuedTape::emplace_back
            (&this->super_PulseQueuedTape,this->current_level_ ^ Low,
             (Time)((ulong)data_block->length_of_sync_first_pulse | 0x3567e000000000));
  bVar1 = this->current_level_;
  this->current_level_ = (bool)(bVar1 ^ 1);
  PulseQueuedTape::emplace_back
            (&this->super_PulseQueuedTape,(uint)bVar1,
             (Time)((ulong)data_block->length_of_sync_second_pulse | 0x3567e000000000));
  this->current_level_ = (bool)(this->current_level_ ^ 1);
  get_data(this,&data_block->data);
  return;
}

Assistant:

void TZX::get_data_block(const DataBlock &data_block) {
	// Output pilot tone.
	post_pulses(data_block.length_of_pilot_tone, data_block.length_of_pilot_pulse);

	// Output sync pulses.
	post_pulse(data_block.length_of_sync_first_pulse);
	post_pulse(data_block.length_of_sync_second_pulse);

	get_data(data_block.data);
}